

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

cl_int __thiscall
CLIntercept::WriteBuffer
          (CLIntercept *this,cl_command_queue commandQueue,cl_mem dstBuffer,cl_bool blockingWrite,
          size_t dstOffset,size_t bytesToWrite,void *srcPtr,cl_uint numEventsInWaitList,
          cl_event *eventWaitList,cl_event *event)

{
  mutex *__mutex;
  size_t srcOffset;
  cl_int cVar1;
  int iVar2;
  cl_mem srcBuffer;
  undefined8 uVar3;
  ulong uVar4;
  cl_int errorCode;
  size_t local_50;
  cl_context context;
  cl_mem local_40;
  size_t local_38;
  
  __mutex = &this->m_Mutex;
  local_50 = bytesToWrite;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 != 0) {
    uVar3 = std::__throw_system_error(iVar2);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar3);
  }
  errorCode = 0;
  context = (cl_context)0x0;
  local_40 = dstBuffer;
  local_38 = dstOffset;
  errorCode = (*(this->m_Dispatch).clGetCommandQueueInfo)
                        (commandQueue,0x1090,8,&context,(size_t *)0x0);
  uVar4 = (ulong)((uint)srcPtr & 0xfff);
  srcBuffer = (cl_mem)0x0;
  srcOffset = 0;
  if (errorCode == 0) {
    srcBuffer = (*(this->m_Dispatch).clCreateBuffer)
                          (context,0xc,local_50 + uVar4,(void *)((long)srcPtr - uVar4),&errorCode);
    srcOffset = uVar4;
  }
  if (errorCode == 0) {
    errorCode = CopyBufferHelper(this,context,commandQueue,srcBuffer,local_40,srcOffset,local_38,
                                 local_50,numEventsInWaitList,eventWaitList,event);
  }
  if ((blockingWrite != 0) && (errorCode == 0)) {
    errorCode = (*(this->m_Dispatch).clFinish)(commandQueue);
  }
  (*(this->m_Dispatch).clReleaseMemObject)(srcBuffer);
  cVar1 = errorCode;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return cVar1;
}

Assistant:

cl_int CLIntercept::WriteBuffer(
    cl_command_queue commandQueue,
    cl_mem dstBuffer,
    cl_bool blockingWrite,
    size_t dstOffset,
    size_t bytesToWrite,
    const void* srcPtr,
    cl_uint numEventsInWaitList,
    const cl_event* eventWaitList,
    cl_event* event )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_int  errorCode = CL_SUCCESS;

    cl_context  context = NULL;

    // Get the context for this command queue.
    if( errorCode == CL_SUCCESS )
    {
        errorCode = dispatch().clGetCommandQueueInfo(
            commandQueue,
            CL_QUEUE_CONTEXT,
            sizeof( context ),
            &context,
            NULL );
    }

    size_t  srcOffset = 0;

    // Align the passed-in pointer to a page boundary.
    if( errorCode == CL_SUCCESS )
    {
        const size_t    alignSize = 4096;

        unsigned char*  bptr = (unsigned char*)srcPtr;
        uintptr_t   uiptr = (uintptr_t)bptr;

        srcOffset = uiptr % alignSize;
        bptr -= srcOffset;

        srcPtr = bptr;
    }

    cl_mem  srcBuffer = NULL;

    // Create a USE_HOST_PTR buffer for the passed-in pointer.
    // The size of the buffer will be at least srcOffset + bytesToWrite.
    if( errorCode == CL_SUCCESS )
    {
        size_t  srcBufferSize = srcOffset + bytesToWrite;

        srcBuffer = dispatch().clCreateBuffer(
            context,
            CL_MEM_USE_HOST_PTR | CL_MEM_READ_ONLY,
            srcBufferSize,
            (void*)srcPtr,
            &errorCode );
    }

    if( errorCode == CL_SUCCESS )
    {
        errorCode = CopyBufferHelper(
            context,
            commandQueue,
            srcBuffer,
            dstBuffer,
            srcOffset,
            dstOffset,
            bytesToWrite,
            numEventsInWaitList,
            eventWaitList,
            event );
    }

    if( errorCode == CL_SUCCESS )
    {
        if( blockingWrite )
        {
            errorCode = dispatch().clFinish(
                commandQueue );
        }
    }

    dispatch().clReleaseMemObject( srcBuffer );

    return errorCode;
}